

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::BinaryLogLoss::forward_impl
          (BinaryLogLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  uint uVar1;
  size_t i;
  ulong uVar2;
  float fVar3;
  FBinaryLogLoss bll;
  Tensor x;
  Tensor y;
  FBinaryLogLoss local_b5;
  float local_b4;
  Tensor local_b0;
  Tensor local_68;
  
  Tensor::Tensor(&local_b0,
                 *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start);
  Tensor::Tensor(&local_68,
                 (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                 ._M_impl.super__Vector_impl_data._M_start[1]);
  uVar1 = Dim::size(&local_b0.d);
  fVar3 = 0.0;
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    local_b4 = fVar3;
    fVar3 = FBinaryLogLoss::operator()(&local_b5,local_b0.v[uVar2],local_68.v[uVar2]);
    fVar3 = local_b4 + fVar3;
  }
  *fx->v = fVar3;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_68.bs);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_b0.bs);
  return;
}

Assistant:

void BinaryLogLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("BinaryLogLoss not yet implemented for CUDA");
#else
  auto x = *xs[0];
  auto y = *xs[1];
  FBinaryLogLoss bll;
  const size_t s = x.d.size();
  float dist = 0;
  for (size_t i = 0; i < s; ++i)
    dist += bll(x.v[i], y.v[i]);
  fx.v[0] = dist;
#endif
}